

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int unres_data_add(unres_data *unres,lyd_node *node,UNRES_ITEM type)

{
  lyd_node **pplVar1;
  LY_ERR *pLVar2;
  UNRES_ITEM *pUVar3;
  UNRES_ITEM type_local;
  lyd_node *node_local;
  unres_data *unres_local;
  
  if ((unres == (unres_data *)0x0) || (node == (lyd_node *)0x0)) {
    __assert_fail("unres && node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x1e35,
                  "int unres_data_add(struct unres_data *, struct lyd_node *, enum UNRES_ITEM)");
  }
  if ((((type != UNRES_LEAFREF) && (type != UNRES_INSTID)) && (type != UNRES_WHEN)) &&
     (((type != UNRES_MUST && (type != UNRES_MUST_INOUT)) && (type != UNRES_UNION)))) {
    __assert_fail("(type == UNRES_LEAFREF) || (type == UNRES_INSTID) || (type == UNRES_WHEN) || (type == UNRES_MUST) || (type == UNRES_MUST_INOUT) || (type == UNRES_UNION)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x1e37,
                  "int unres_data_add(struct unres_data *, struct lyd_node *, enum UNRES_ITEM)");
  }
  unres->count = unres->count + 1;
  pplVar1 = (lyd_node **)ly_realloc(unres->node,(ulong)unres->count << 3);
  unres->node = pplVar1;
  if (unres->node == (lyd_node **)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","unres_data_add");
    unres_local._4_4_ = -1;
  }
  else {
    unres->node[unres->count - 1] = node;
    pUVar3 = (UNRES_ITEM *)ly_realloc(unres->type,(ulong)unres->count << 2);
    unres->type = pUVar3;
    if (unres->type == (UNRES_ITEM *)0x0) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","unres_data_add");
      unres_local._4_4_ = -1;
    }
    else {
      unres->type[unres->count - 1] = type;
      if (type == UNRES_WHEN) {
        node->field_0x9 = node->field_0x9 & 0xf1 | 8;
      }
      unres_local._4_4_ = 0;
    }
  }
  return unres_local._4_4_;
}

Assistant:

int
unres_data_add(struct unres_data *unres, struct lyd_node *node, enum UNRES_ITEM type)
{
    assert(unres && node);
    assert((type == UNRES_LEAFREF) || (type == UNRES_INSTID) || (type == UNRES_WHEN) || (type == UNRES_MUST)
           || (type == UNRES_MUST_INOUT) || (type == UNRES_UNION));

    unres->count++;
    unres->node = ly_realloc(unres->node, unres->count * sizeof *unres->node);
    if (!unres->node) {
        LOGMEM;
        return -1;
    }
    unres->node[unres->count - 1] = node;
    unres->type = ly_realloc(unres->type, unres->count * sizeof *unres->type);
    if (!unres->type) {
        LOGMEM;
        return -1;
    }
    unres->type[unres->count - 1] = type;

    if (type == UNRES_WHEN) {
        /* remove previous result */
        node->when_status = LYD_WHEN;
    }

    return EXIT_SUCCESS;
}